

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void * __thiscall
google::protobuf::Reflection::MutableRawRepeatedField
          (Reflection *this,Message *message,FieldDescriptor *field,CppType cpptype,int ctype,
          Descriptor *desc)

{
  FieldDescriptor field_type;
  int number;
  bool bVar1;
  CppType CVar2;
  uint32_t uVar3;
  Descriptor *pDVar4;
  LogMessage *pLVar5;
  MapFieldBase *this_00;
  FieldDescriptor *local_70;
  LogMessage local_68;
  
  if ((~(byte)field[1] & 0x60) != 0) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"\"MutableRawRepeatedField\"",
               "Field is singular; the method requires a repeated field.");
  }
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_68._0_8_ = FieldDescriptor::TypeOnceInit;
    local_70 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_68,&local_70)
    ;
  }
  CVar2 = *(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4);
  if (CVar2 != cpptype) {
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_68._0_8_ = FieldDescriptor::TypeOnceInit;
      local_70 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_68,
                 &local_70);
      CVar2 = *(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4);
    }
    if ((cpptype != CPPTYPE_INT32) || (CVar2 != CPPTYPE_ENUM)) {
      anon_unknown_0::ReportReflectionUsageTypeError
                (this->descriptor_,field,"MutableRawRepeatedField",cpptype);
    }
  }
  if ((desc != (Descriptor *)0x0) && (pDVar4 = FieldDescriptor::message_type(field), pDVar4 != desc)
     ) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x8d1);
    pLVar5 = internal::LogMessage::operator<<
                       (&local_68,"CHECK failed: (field->message_type()) == (desc): ");
    pLVar5 = internal::LogMessage::operator<<(pLVar5,"wrong submessage type");
    internal::LogFinisher::operator=((LogFinisher *)&local_70,pLVar5);
    internal::LogMessage::~LogMessage(&local_68);
  }
  if (((byte)field[1] & 8) == 0) {
    bVar1 = anon_unknown_0::IsMapFieldInApi(field);
    uVar3 = internal::ReflectionSchema::GetFieldOffsetNonOneof(&this->schema_,field);
    this_00 = (MapFieldBase *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3)
    ;
    if (bVar1) {
      this_00 = (MapFieldBase *)internal::MapFieldBase::MutableRepeatedField(this_00);
    }
  }
  else {
    uVar3 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    number = *(int *)(field + 4);
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_68._0_8_ = FieldDescriptor::TypeOnceInit;
      local_70 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_68,
                 &local_70);
    }
    field_type = field[2];
    bVar1 = FieldDescriptor::is_packed(field);
    this_00 = (MapFieldBase *)
              internal::ExtensionSet::MutableRawRepeatedField
                        ((ExtensionSet *)
                         ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3),
                         number,(FieldType)field_type,bVar1,field);
  }
  return this_00;
}

Assistant:

void* Reflection::MutableRawRepeatedField(Message* message,
                                          const FieldDescriptor* field,
                                          FieldDescriptor::CppType cpptype,
                                          int ctype,
                                          const Descriptor* desc) const {
  (void)ctype;  // Parameter is used by Google-internal code.
  USAGE_CHECK_REPEATED("MutableRawRepeatedField");
  CheckInvalidAccess(schema_, field);

  if (field->cpp_type() != cpptype &&
      (field->cpp_type() != FieldDescriptor::CPPTYPE_ENUM ||
       cpptype != FieldDescriptor::CPPTYPE_INT32))
    ReportReflectionUsageTypeError(descriptor_, field,
                                   "MutableRawRepeatedField", cpptype);
  if (desc != nullptr)
    GOOGLE_CHECK_EQ(field->message_type(), desc) << "wrong submessage type";
  if (field->is_extension()) {
    return MutableExtensionSet(message)->MutableRawRepeatedField(
        field->number(), field->type(), field->is_packed(), field);
  } else {
    // Trigger transform for MapField
    if (IsMapFieldInApi(field)) {
      return MutableRawNonOneof<MapFieldBase>(message, field)
          ->MutableRepeatedField();
    }
    return MutableRawNonOneof<void>(message, field);
  }
}